

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O3

int ffgclsb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           long elemincre,int nultyp,char nulval,char *array,char *nularray,int *anynul,int *status)

{
  uchar *values;
  fitsfile *fptr_00;
  uint colnum_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long nvals;
  double dVar7;
  double dVar8;
  int local_71e8;
  double zero;
  double scale;
  fitsfile *local_71d0;
  uint local_71c4;
  int hdutype;
  int tcode;
  LONGLONG tnull;
  long local_71b0;
  ulong local_71a8;
  long incre;
  int maxelem;
  long twidth;
  LONGLONG repeat;
  double local_7180;
  long local_7178;
  LONGLONG rowlen;
  LONGLONG startpos;
  int decimals;
  int xcode;
  char tform [20];
  char snull [20];
  long xwidth;
  char message [81];
  double cbuff [3600];
  
  iVar1 = *status;
  if (nelem != 0 && iVar1 < 1) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_71c4 = colnum;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    colnum_00 = local_71c4;
    local_71b0 = firstelem;
    ffgcprll(fptr,local_71c4,firstrow,firstelem,nelem,(int)(elemincre >> 0x3f),&scale,&zero,tform,
             &twidth,&tcode,&maxelem,&startpos,(LONGLONG *)&local_71a8,&incre,&repeat,&rowlen,
             &hdutype,&tnull,snull,status);
    iVar6 = tcode;
    if (elemincre == 1 && tcode == 0xe) {
      ffgcll(fptr,colnum_00,firstrow,local_71b0,nelem,nultyp,nulval,array,nularray,anynul,status);
LAB_00156edc:
      iVar1 = *status;
    }
    else {
      local_71d0 = fptr;
      pcVar2 = strchr(tform,0x41);
      iVar1 = *status;
      if (pcVar2 != (char *)0x0) {
        if (iVar1 == 0x134) {
          *status = 0;
          ffcmsg();
          iVar1 = *status;
        }
        tcode = 0xb;
        incre = 1;
        repeat = twidth;
        twidth = 1;
        scale = 1.0;
        zero = 0.0;
        tnull = 0x4995cdd1;
        maxelem = 0x7080;
        iVar6 = 0xb;
      }
      if (iVar1 < 1) {
        incre = incre * elemincre;
        local_7180 = 1.0;
        if (iVar6 == 0x10) {
          if (hdutype == 1) {
            ffasfm(tform,&xcode,&xwidth,&decimals,status);
            lVar3 = (long)decimals;
            local_7180 = 1.0;
            if (0 < lVar3) {
              local_7180 = 1.0;
              do {
                local_7180 = local_7180 * 10.0;
                lVar3 = lVar3 + -1;
              } while (lVar3 != 0);
            }
          }
          else {
            local_7180 = 1.0;
          }
        }
        local_71e8 = 0;
        if ((((nultyp != 1 || nulval != '\0') && (tcode % 10 != 1 || tnull != 0x4995cdd1)) &&
            (tcode != 0x15 || (short)tnull == tnull)) && (tcode != 0xb || (ulong)tnull < 0x100)) {
          local_71e8 = 0;
          if (snull[0] != '\x01') {
            local_71e8 = nultyp;
          }
          if (tcode != 0x10) {
            local_71e8 = nultyp;
          }
        }
        local_7178 = -elemincre;
        lVar3 = 0;
        local_71b0 = 0;
LAB_001570ff:
        fptr_00 = local_71d0;
        lVar5 = (long)maxelem;
        if (nelem < maxelem) {
          lVar5 = nelem;
        }
        if (elemincre < 0) {
          lVar4 = (long)local_71a8 / local_7178;
        }
        else {
          lVar4 = (long)(~local_71a8 + repeat) / elemincre;
        }
        nvals = lVar4 + 1;
        if (lVar5 <= lVar4) {
          nvals = lVar5;
        }
        lVar5 = (incre / elemincre) * local_71a8 + rowlen * local_71b0 + startpos;
        if (tcode < 0x29) {
          if (tcode == 0xb) {
            values = (uchar *)(array + lVar3);
            ffgi1b(local_71d0,lVar5,nvals,incre,values,status);
            fffi1s1(values,nvals,scale,zero,local_71e8,(uchar)tnull,nulval,nularray + lVar3,anynul,
                    (char *)values,status);
          }
          else if (tcode == 0x10) {
            ffmbyt(local_71d0,lVar5,0,status);
            if (incre - twidth == 0) {
              ffgbyt(fptr_00,incre * nvals,cbuff,status);
            }
            else {
              ffgbytoff(fptr_00,twidth,nvals,incre - twidth,cbuff,status);
            }
            fffstrs1((char *)cbuff,nvals,scale,zero,twidth,local_7180,local_71e8,snull,nulval,
                     nularray + lVar3,anynul,array + lVar3,status);
          }
          else {
            if (tcode != 0x15) goto LAB_001575c8;
            ffgi2b(local_71d0,lVar5,nvals,incre,(short *)cbuff,status);
            fffi2s1((short *)cbuff,nvals,scale,zero,local_71e8,(short)tnull,nulval,nularray + lVar3,
                    anynul,array + lVar3,status);
          }
        }
        else if (tcode < 0x51) {
          if (tcode == 0x29) {
            ffgi4b(local_71d0,lVar5,nvals,incre,(int *)cbuff,status);
            fffi4s1((int *)cbuff,nvals,scale,zero,local_71e8,(int)tnull,nulval,nularray + lVar3,
                    anynul,array + lVar3,status);
          }
          else {
            if (tcode != 0x2a) {
LAB_001575c8:
              snprintf(message,0x51,"Cannot read bytes from column %d which has format %s",
                       (ulong)local_71c4,tform);
              ffpmsg(message);
              if (hdutype == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffgr4b(local_71d0,lVar5,nvals,incre,(float *)cbuff,status);
            fffr4s1((float *)cbuff,nvals,scale,zero,local_71e8,nulval,nularray + lVar3,anynul,
                    array + lVar3,status);
          }
        }
        else if (tcode == 0x51) {
          ffgi8b(local_71d0,lVar5,nvals,incre,(long *)cbuff,status);
          fffi8s1((LONGLONG *)cbuff,nvals,scale,zero,local_71e8,tnull,nulval,nularray + lVar3,anynul
                  ,array + lVar3,status);
        }
        else {
          if (tcode != 0x52) goto LAB_001575c8;
          ffgr8b(local_71d0,lVar5,nvals,incre,cbuff,status);
          fffr8s1(cbuff,nvals,scale,zero,local_71e8,nulval,nularray + lVar3,anynul,array + lVar3,
                  status);
        }
        iVar1 = *status;
        if (0 < iVar1) {
          dVar7 = (double)lVar3 + 1.0;
          dVar8 = (double)nvals + (double)lVar3;
          if (hdutype < 1) {
            snprintf(message,0x51,"Error reading elements %.0f thru %.0f from image (ffgclsb).",
                     dVar7,dVar8,(ulong)local_71c4);
          }
          else {
            snprintf(message,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
                     dVar7,dVar8,(ulong)local_71c4);
          }
          ffpmsg(message);
          goto LAB_00156edc;
        }
        nelem = nelem - nvals;
        if (nelem != 0) {
          lVar3 = lVar3 + nvals;
          local_71a8 = nvals * elemincre + local_71a8;
          if ((long)local_71a8 < repeat) goto code_r0x001574df;
          lVar5 = (long)local_71a8 / repeat;
          local_71a8 = (long)local_71a8 % repeat;
          goto LAB_00157524;
        }
        if (iVar1 == -0xb) {
          ffpmsg("Numerical overflow during type conversion while reading FITS data.");
          *status = 0x19c;
          iVar1 = 0x19c;
        }
      }
    }
  }
  return iVar1;
code_r0x001574df:
  if ((long)local_71a8 < 0) {
    lVar4 = (long)~local_71a8 / repeat + 1;
    lVar5 = -lVar4;
    local_71a8 = lVar4 * repeat + local_71a8;
LAB_00157524:
    local_71b0 = local_71b0 + lVar5;
  }
  goto LAB_001570ff;
}

Assistant:

int ffgclsb(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            signed char nulval,   /* I - value for null pixels if nultyp = 1 */
            signed char *array,   /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       signed char scharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);

    /* special case: read column of T/F logicals */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.scharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (strchr(tform,'A') != NULL) 
    {
        if (*status == BAD_ELEM_NUM)
        {
            /* ignore this error message */
            *status = 0;
            ffcmsg();   /* clear error stack */
        }

        /*  interpret a 'A' ASCII column as a 'B' byte column ('8A' == '8B') */
        /*  This is an undocumented 'feature' in CFITSIO */

        /*  we have to reset some of the values returned by ffgcpr */
        
        tcode = TBYTE;
        incre = 1;         /* each element is 1 byte wide */
        repeat = twidth;   /* total no. of chars in the col */
        twidth = 1;        /* width of each element */
        scale = 1.0;       /* no scaling */
        zero  = 0.0;
        tnull = NULL_UNDEFINED;  /* don't test for nulls */
        maxelem = DBUFFSIZE;
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + (rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) &array[next], status);
                fffi1s1((unsigned char *)&array[next], ntodo, scale, zero,
                        nulcheck, (unsigned char) tnull, nulval, &nularray[next], 
                        anynul, &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2s1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4s1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8s1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4s1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8s1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstrs1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclsb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}